

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.h
# Opt level: O2

char * __thiscall Potassco::ProgramOptions::Option::argName(Option *this)

{
  char *pcVar1;
  
  pcVar1 = Value::arg(this->value_);
  return pcVar1;
}

Assistant:

const char*        argName()        const { return value_->arg(); }